

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::fixBlockUniformLayoutPacking
          (TParseContext *this,TQualifier *qualifier,TTypeList *originTypeList,
          TTypeList *tmpTypeList)

{
  _Vector_impl_data *p_Var1;
  _Vector_impl_data *p_Var2;
  TType *pTVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  pointer pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *pTVar8;
  TTypeList *pTVar9;
  pointer pTVar10;
  byte bVar11;
  int __flags;
  long lVar12;
  ulong uVar13;
  void *__child_stack;
  ulong uVar15;
  TQualifier *__fn;
  TParseContext *this_00;
  void *in_R8;
  ulong uVar16;
  undefined4 extraout_var_02;
  TQualifier *pTVar14;
  
  if (tmpTypeList == (TTypeList *)0x0) {
    pTVar7 = (originTypeList->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar10 = (originTypeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    __fn = qualifier;
  }
  else {
    pTVar7 = (originTypeList->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar10 = (originTypeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    __fn = (TQualifier *)
           ((long)(tmpTypeList->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(tmpTypeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    if ((TQualifier *)((long)pTVar10 - (long)pTVar7) != __fn) {
      __assert_fail("tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x26b9,
                    "void glslang::TParseContext::fixBlockUniformLayoutPacking(TQualifier &, TTypeList *, TTypeList *)"
                   );
    }
  }
  if (pTVar10 != pTVar7) {
    p_Var1 = &(originTypeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data;
    p_Var2 = &(tmpTypeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data;
    uVar15 = 0;
    uVar16 = 1;
    do {
      pTVar14 = qualifier;
      if ((qualifier->field_0x10 & 0xf) != 0) {
        if (tmpTypeList == (TTypeList *)0x0) {
          iVar6 = (*(pTVar7[uVar15].type)->_vptr_TType[10])();
          if ((*(byte *)(CONCAT44(extraout_var_00,iVar6) + 0x10) & 0xf) == 0) {
            iVar6 = (*(p_Var1->_M_start[uVar15].type)->_vptr_TType[0x1a])();
            cVar5 = (char)iVar6;
            pTVar14 = (TQualifier *)p_Var1;
            goto LAB_00434a17;
          }
        }
        else {
          iVar6 = (*(p_Var2->_M_start[uVar15].type)->_vptr_TType[10])();
          if ((*(byte *)(CONCAT44(extraout_var,iVar6) + 0x10) & 0xf) == 0) {
            iVar6 = (*(p_Var2->_M_start[uVar15].type)->_vptr_TType[0x1a])();
            cVar5 = (char)iVar6;
            pTVar14 = (TQualifier *)p_Var2;
LAB_00434a17:
            if (cVar5 == '\0') {
              bVar11 = qualifier->field_0x10;
              lVar12 = uVar15 * 0x20;
              iVar6 = (*(((pointer)pTVar14->semanticName)[uVar15].type)->_vptr_TType[10])();
              uVar13 = CONCAT71((int7)((ulong)lVar12 >> 8),
                                *(undefined1 *)(CONCAT44(extraout_var_01,iVar6) + 0x10)) &
                       0xfffffffffffffff0;
              bVar11 = (byte)uVar13 | bVar11 & 0xf;
              pTVar14 = (TQualifier *)CONCAT71((int7)(uVar13 >> 8),bVar11);
              *(byte *)(CONCAT44(extraout_var_01,iVar6) + 0x10) = bVar11;
            }
          }
        }
      }
      __flags = (int)pTVar14;
      iVar6 = (*(p_Var1->_M_start[uVar15].type)->_vptr_TType[7])();
      if (iVar6 == 0xf) {
        if (tmpTypeList == (TTypeList *)0x0) {
          iVar6 = TType::clone(p_Var1->_M_start[uVar15].type,(__fn *)__fn,__child_stack,__flags,
                               in_R8);
          pTVar8 = (TType *)CONCAT44(extraout_var_02,iVar6);
        }
        else {
          pTVar8 = p_Var2->_M_start[uVar15].type;
        }
        pTVar3 = p_Var1->_M_start[uVar15].type;
        iVar6 = (*pTVar3->_vptr_TType[0x25])(pTVar3);
        if ((char)iVar6 == '\0') {
LAB_00434b52:
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
        }
        pTVar9 = (pTVar3->field_13).structure;
        iVar6 = (*pTVar8->_vptr_TType[0x25])(pTVar8);
        if ((char)iVar6 == '\0') goto LAB_00434b52;
        this_00 = this;
        fixBlockUniformLayoutPacking(this,qualifier,pTVar9,(pTVar8->field_13).structure);
        __fn = (TQualifier *)&this->packingFixRecord;
        pTVar9 = recordStructCopy(this_00,&this->packingFixRecord,p_Var1->_M_start[uVar15].type,
                                  pTVar8);
        if (tmpTypeList == (TTypeList *)0x0) {
          pTVar10 = p_Var1->_M_start;
        }
        else {
          pTVar10 = p_Var2->_M_start;
        }
        pTVar8 = pTVar10[uVar15].type;
        iVar6 = (*pTVar8->_vptr_TType[0x25])(pTVar8);
        if ((char)iVar6 == '\0') {
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9e0,"void glslang::TType::setStruct(TTypeList *)");
        }
        (pTVar8->field_13).structure = pTVar9;
      }
      pTVar7 = (originTypeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar16 < (ulong)((long)(originTypeList->
                                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ).
                                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 5)
      ;
      uVar15 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar4);
  }
  return;
}

Assistant:

void TParseContext::fixBlockUniformLayoutPacking(TQualifier& qualifier, TTypeList* originTypeList,
                                                 TTypeList* tmpTypeList)
{
    assert(tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size());
    for (unsigned int member = 0; member < originTypeList->size(); ++member) {
        if (qualifier.layoutPacking != ElpNone) {
            if (tmpTypeList == nullptr) {
                if ((*originTypeList)[member].type->getQualifier().layoutPacking == ElpNone &&
                    !(*originTypeList)[member].type->isScalarOrVector()) {
                    (*originTypeList)[member].type->getQualifier().layoutPacking = qualifier.layoutPacking;
                }
            } else {
                if ((*tmpTypeList)[member].type->getQualifier().layoutPacking == ElpNone &&
                    !(*tmpTypeList)[member].type->isScalarOrVector()) {
                    (*tmpTypeList)[member].type->getQualifier().layoutPacking = qualifier.layoutPacking;
                }
            }
        }

        if ((*originTypeList)[member].type->getBasicType() == EbtStruct) {
            // Deep copy the type in pool.
            // Because, struct use in different block may have different layout qualifier.
            // We have to new a object to distinguish between them.
            const TType* tmpType = tmpTypeList == nullptr ?
                (*originTypeList)[member].type->clone() : (*tmpTypeList)[member].type;

            fixBlockUniformLayoutPacking(qualifier, (*originTypeList)[member].type->getWritableStruct(),
                                         tmpType->getWritableStruct());

            const TTypeList* structure = recordStructCopy(packingFixRecord, (*originTypeList)[member].type, tmpType);

            if (tmpTypeList == nullptr) {
                (*originTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
            if (tmpTypeList != nullptr) {
                (*tmpTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
        }
    }
}